

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

ssize_t httplib::detail::write_headers(Stream *strm,Headers *headers)

{
  int iVar1;
  ssize_t sVar2;
  _Rb_tree_node_base *p_Var3;
  int extraout_var;
  long lVar4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  long unaff_R15;
  bool bVar7;
  char *local_40;
  char *local_38;
  
  p_Var3 = (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(headers->_M_t)._M_impl.super__Rb_tree_header;
  bVar7 = (_Rb_tree_header *)p_Var3 == p_Var6;
  if (bVar7) {
    lVar4 = 0;
  }
  else {
    local_38 = *(char **)(p_Var3 + 1);
    local_40 = *(char **)(p_Var3 + 2);
    sVar2 = Stream::write_format<char_const*,char_const*>(strm,"%s: %s\r\n",&local_38,&local_40);
    lVar5 = sVar2;
    unaff_R15 = sVar2;
    lVar4 = 0;
    while (-1 < unaff_R15) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      bVar7 = (_Rb_tree_header *)p_Var3 == p_Var6;
      lVar4 = lVar5;
      unaff_R15 = sVar2;
      if (bVar7) break;
      local_38 = *(char **)(p_Var3 + 1);
      local_40 = *(char **)(p_Var3 + 2);
      unaff_R15 = Stream::write_format<char_const*,char_const*>
                            (strm,"%s: %s\r\n",&local_38,&local_40);
      lVar4 = 0;
      if (-1 < unaff_R15) {
        lVar4 = unaff_R15;
      }
      lVar5 = lVar5 + lVar4;
      lVar4 = lVar5;
    }
  }
  if (bVar7) {
    iVar1 = (*strm->_vptr_Stream[5])(strm,"\r\n",2);
    if (extraout_var < 0) {
      lVar4 = 0;
    }
    unaff_R15 = lVar4 + CONCAT44(extraout_var,iVar1);
  }
  return unaff_R15;
}

Assistant:

inline ssize_t write_headers(Stream &strm, const Headers &headers) {
  ssize_t write_len = 0;
  for (const auto &x : headers) {
    auto len =
        strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
    if (len < 0) { return len; }
    write_len += len;
  }
  auto len = strm.write("\r\n");
  if (len < 0) { return len; }
  write_len += len;
  return write_len;
}